

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

Vec_Int_t * Glucose_SolverFromAig2(Gia_Man_t *p,SimpSolver *S)

{
  int *plits;
  int iVar1;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar2;
  long lVar3;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  lVar3 = 0;
  do {
    if (p_00->nClauses <= lVar3) {
      pVVar2 = Vec_IntAllocArrayCopy(p_00->pVarNums,p_00->nVars);
      Cnf_DataFree(p_00);
      return pVVar2;
    }
    plits = p_00->pClauses[lVar3];
    iVar1 = glucose_solver_addclause
                      (S,plits,(int)((ulong)((long)p_00->pClauses[lVar3 + 1] - (long)plits) >> 2));
    lVar3 = lVar3 + 1;
  } while (iVar1 != 0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                ,0x2d6,"Vec_Int_t *Glucose_SolverFromAig2(Gia_Man_t *, SimpSolver &)");
}

Assistant:

Vec_Int_t * Glucose_SolverFromAig2( Gia_Man_t * p, SimpSolver& S ) 
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8 /*nLutSize*/, 0 /*fCnfObjIds*/, 1/*fAddOrCla*/, 0, 0/*verbose*/ );
    for ( int i = 0; i < pCnf->nClauses; i++ )
        if ( !glucose_solver_addclause( &S, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
    Vec_Int_t * vCnfIds = Vec_IntAllocArrayCopy(pCnf->pVarNums,pCnf->nVars);
    //printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
    //Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Cnf_DataFree(pCnf);
    return vCnfIds;
}